

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hpp
# Opt level: O0

void __thiscall
duckdb::roaring::ArrayContainerScanState<true>::Verify(ArrayContainerScanState<true> *this)

{
  ArrayContainerScanState<true> *this_local;
  
  return;
}

Assistant:

void Verify() const override {
#ifdef DEBUG
		uint16_t index = 0;
		auto array = reinterpret_cast<uint16_t *>(data);
		for (uint16_t i = 0; i < count; i++) {
			D_ASSERT(!i || array[i] > index);
			index = array[i];
		}
#endif
	}